

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O2

void drawGuards(WINDOW *body,Map *map,UnitList *guards)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  UnitNode *pUVar5;
  
  pUVar5 = getHead(guards);
  iVar3 = *(int *)((long)pUVar5->unit + 4);
  uVar2 = (long)(iVar3 + -1) / 0x48;
  getCoordinate::coordinates[0] = (int)uVar2;
  getCoordinate::coordinates[1] = getCoordinate::coordinates[0] * -0x48 + iVar3 + 1;
  cVar1 = *pUVar5->unit;
  iVar3 = wmove(body,uVar2 & 0xffffffff);
  if (iVar3 != -1) {
    waddch(body,(int)cVar1);
  }
  iVar3 = 1;
  while( true ) {
    iVar4 = getLength(guards);
    if (iVar4 + -2 <= iVar3) break;
    pUVar5 = pUVar5->next;
    iVar4 = *(int *)((long)pUVar5->unit + 4);
    uVar2 = (long)(iVar4 + -1) / 0x48;
    getCoordinate::coordinates[0] = (int)uVar2;
    getCoordinate::coordinates[1] = getCoordinate::coordinates[0] * -0x48 + iVar4 + 1;
    cVar1 = *pUVar5->unit;
    iVar4 = wmove(body,uVar2 & 0xffffffff);
    if (iVar4 != -1) {
      waddch(body,(int)cVar1);
    }
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

void drawGuards(WINDOW *body, struct Map *map, struct UnitList *guards) {
    int *coordinates;
    int x;
    struct UnitNode *guardNode;
    struct Guard *guard;
    char type;
    guardNode = getHead(guards);
    guard = (struct Guard *) guardNode->unit;
    coordinates = getCoordinate(guard->position);
    type = guard->type;
    mvwaddch(body, coordinates[0], coordinates[1], type);
    for (x = 1; x < getLength(guards) - 2; x++) {
        guardNode = guardNode->next;
        guard = (struct Guard *) guardNode->unit;
        coordinates = getCoordinate(guard->position);
        type = guard->type;
        mvwaddch(body, coordinates[0], coordinates[1], type);
    }
}